

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfilters.c
# Opt level: O0

CURLcode Curl_conn_shutdown(Curl_easy *data,int sockindex,_Bool *done)

{
  _Bool _Var1;
  CURLcode CVar2;
  char *pcVar3;
  bool bVar4;
  curltime cVar5;
  byte local_61;
  time_t tStack_60;
  _Bool cfdone;
  int local_58;
  undefined4 uStack_54;
  undefined1 local_50 [8];
  curltime now;
  timediff_t timeout_ms;
  Curl_cfilter *pCStack_30;
  CURLcode result;
  Curl_cfilter *cf;
  _Bool *done_local;
  int sockindex_local;
  Curl_easy *data_local;
  
  pCStack_30 = data->conn->cfilter[sockindex];
  while( true ) {
    bVar4 = false;
    if ((pCStack_30 != (Curl_cfilter *)0x0) && (bVar4 = true, (pCStack_30->field_0x24 & 1) != 0)) {
      bVar4 = ((byte)pCStack_30->field_0x24 >> 1 & 1) != 0;
    }
    if (!bVar4) break;
    pCStack_30 = pCStack_30->next;
  }
  if (pCStack_30 == (Curl_cfilter *)0x0) {
    *done = true;
  }
  else {
    *done = false;
    cVar5 = Curl_now();
    tStack_60 = cVar5.tv_sec;
    local_58 = cVar5.tv_usec;
    now.tv_sec = CONCAT44(uStack_54,local_58);
    local_50 = (undefined1  [8])tStack_60;
    _Var1 = Curl_shutdown_started(data,sockindex);
    if (_Var1) {
      now._8_8_ = Curl_shutdown_timeleft(data->conn,sockindex,(curltime *)local_50);
      if ((long)now._8_8_ < 0) {
        if (((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x89c >> 0x1e & 1) != 0))
           && (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level))
              )) {
          Curl_infof(data,"shutdown timeout");
        }
        return CURLE_OPERATION_TIMEDOUT;
      }
    }
    else {
      if (((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x89c >> 0x1e & 1) != 0)) &&
         ((((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)) &&
          (0 < Curl_trc_feat_multi.log_level)))) {
        pcVar3 = "";
        if (sockindex != 0) {
          pcVar3 = " secondary";
        }
        Curl_trc_multi(data,"shutdown start on%s connection",pcVar3);
      }
      Curl_shutdown_start(data,sockindex,0,(curltime *)local_50);
    }
    for (; pCStack_30 != (Curl_cfilter *)0x0; pCStack_30 = pCStack_30->next) {
      if (((byte)pCStack_30->field_0x24 >> 1 & 1) == 0) {
        local_61 = 0;
        CVar2 = (*(code *)pCStack_30->cft->do_shutdown)(pCStack_30,data,&local_61);
        if (CVar2 != CURLE_OK) {
          if (data == (Curl_easy *)0x0) {
            return CVar2;
          }
          if ((*(ulong *)&(data->set).field_0x89c >> 0x1e & 1) == 0) {
            return CVar2;
          }
          if (((data->state).feat != (curl_trc_feat *)0x0) && (((data->state).feat)->log_level < 1))
          {
            return CVar2;
          }
          if (pCStack_30 == (Curl_cfilter *)0x0) {
            return CVar2;
          }
          if (pCStack_30->cft->log_level < 1) {
            return CVar2;
          }
          Curl_trc_cf_infof(data,pCStack_30,"shut down failed with %d",(ulong)CVar2);
          return CVar2;
        }
        if ((local_61 & 1) == 0) {
          if ((((data != (Curl_easy *)0x0) &&
               ((*(ulong *)&(data->set).field_0x89c >> 0x1e & 1) != 0)) &&
              (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level))
              )) && ((pCStack_30 != (Curl_cfilter *)0x0 && (0 < pCStack_30->cft->log_level)))) {
            Curl_trc_cf_infof(data,pCStack_30,"shut down not done yet");
          }
          return CURLE_OK;
        }
        if ((((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x89c >> 0x1e & 1) != 0))
            && (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)
                ))) && ((pCStack_30 != (Curl_cfilter *)0x0 && (0 < pCStack_30->cft->log_level)))) {
          Curl_trc_cf_infof(data,pCStack_30,"shut down successfully");
        }
        pCStack_30->field_0x24 = pCStack_30->field_0x24 & 0xfd | 2;
      }
    }
    *done = true;
  }
  return CURLE_OK;
}

Assistant:

CURLcode Curl_conn_shutdown(struct Curl_easy *data, int sockindex, bool *done)
{
  struct Curl_cfilter *cf;
  CURLcode result = CURLE_OK;
  timediff_t timeout_ms;
  struct curltime now;

  DEBUGASSERT(data->conn);
  /* Get the first connected filter that is not shut down already. */
  cf = data->conn->cfilter[sockindex];
  while(cf && (!cf->connected || cf->shutdown))
    cf = cf->next;

  if(!cf) {
    *done = TRUE;
    return CURLE_OK;
  }

  *done = FALSE;
  now = Curl_now();
  if(!Curl_shutdown_started(data, sockindex)) {
    CURL_TRC_M(data, "shutdown start on%s connection",
               sockindex ? " secondary" : "");
    Curl_shutdown_start(data, sockindex, 0, &now);
  }
  else {
    timeout_ms = Curl_shutdown_timeleft(data->conn, sockindex, &now);
    if(timeout_ms < 0) {
      /* info message, since this might be regarded as acceptable */
      infof(data, "shutdown timeout");
      return CURLE_OPERATION_TIMEDOUT;
    }
  }

  while(cf) {
    if(!cf->shutdown) {
      bool cfdone = FALSE;
      result = cf->cft->do_shutdown(cf, data, &cfdone);
      if(result) {
        CURL_TRC_CF(data, cf, "shut down failed with %d", result);
        return result;
      }
      else if(!cfdone) {
        CURL_TRC_CF(data, cf, "shut down not done yet");
        return CURLE_OK;
      }
      CURL_TRC_CF(data, cf, "shut down successfully");
      cf->shutdown = TRUE;
    }
    cf = cf->next;
  }
  *done = (!result);
  return result;
}